

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CordOutputStream::CordOutputStream
          (CordOutputStream *this,CordBuffer *buffer,size_t size_hint)

{
  byte bVar1;
  void *pvVar2;
  ulong uVar3;
  sbyte sVar4;
  ulong uVar5;
  int iVar6;
  sbyte sVar7;
  int iVar8;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CordOutputStream_00461dc8;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.cordz_info = 0;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  this->size_hint_ = size_hint;
  bVar1 = (buffer->rep_).field_0.short_rep.raw_size;
  if ((bVar1 & 1) == 0) {
    uVar3 = (((buffer->rep_).field_0.long_rep.rep)->super_CordRep).length;
  }
  else {
    uVar3 = (ulong)((char)bVar1 >> 1);
  }
  uVar5 = 0xf;
  if ((bVar1 & 1) == 0) {
    bVar1 = (((buffer->rep_).field_0.long_rep.rep)->super_CordRep).tag;
    iVar6 = -0xb8000;
    if (bVar1 < 0xbb) {
      iVar6 = -0xe80;
    }
    sVar7 = 0xc;
    if (bVar1 < 0xbb) {
      sVar7 = 6;
    }
    iVar8 = -0x10;
    if (0x42 < bVar1) {
      iVar8 = iVar6;
    }
    sVar4 = 3;
    if (0x42 < bVar1) {
      sVar4 = sVar7;
    }
    uVar5 = (ulong)(int)(((uint)bVar1 << sVar4) + iVar8 + -0xd);
  }
  this->state_ = (uVar3 < uVar5) + kFull;
  pvVar2 = (buffer->rep_).field_0.long_rep.padding;
  (this->buffer_).rep_.field_0.long_rep.rep = (buffer->rep_).field_0.long_rep.rep;
  (this->buffer_).rep_.field_0.long_rep.padding = pvVar2;
  (buffer->rep_).field_0.short_rep.raw_size = '\x01';
  return;
}

Assistant:

CordOutputStream::CordOutputStream(absl::CordBuffer buffer, size_t size_hint)
    : size_hint_(size_hint),
      state_(buffer.length() < buffer.capacity() ? State::kPartial
                                                 : State::kFull),
      buffer_(std::move(buffer)) {}